

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

Class * __thiscall cppgenerate::Class::operator=(Class *this,Class *other)

{
  if (this != other) {
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::_M_assign((string *)&this->m_namespace);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->m_systemIncludes)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->m_systemIncludes)._M_t,&(other->m_systemIncludes)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->m_localIncludes)._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->m_localIncludes)._M_t,&(other->m_localIncludes)._M_t);
    std::vector<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>::clear(&this->m_methods);
    std::vector<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>::operator=
              (&this->m_methods,&other->m_methods);
    std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::clear
              (&this->m_memberVariables);
    std::__cxx11::string::_M_assign((string *)&this->m_documentation);
    this->m_isQobject = other->m_isQobject;
    std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::clear
              (&this->m_constructors);
    std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::operator=
              (&this->m_constructors,&other->m_constructors);
    std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::clear
              (&this->m_parents);
    std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::operator=
              (&this->m_parents,&other->m_parents);
  }
  return this;
}

Assistant:

Class& Class::operator=( const Class& other ){
    if( this != &other ){
        m_className = other.m_className;
        m_namespace = other.m_namespace;
        m_systemIncludes.clear();
        m_systemIncludes = other.m_systemIncludes;
        m_localIncludes.clear();
        m_localIncludes = other.m_localIncludes;
        m_methods.clear();
        m_methods = other.m_methods;
        m_memberVariables.clear();
        m_documentation = other.m_documentation;
        m_isQobject = other.m_isQobject;
        m_constructors.clear();
        m_constructors = other.m_constructors;
        m_parents.clear();
        m_parents = other.m_parents;
    }

    return *this;
}